

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quass.cpp
# Opt level: O1

QpAsmStatus
solveqp(Instance *instance,Settings *settings,Statistics *stats,HighsModelStatus *highs_model_status
       ,HighsBasis *highs_basis,HighsSolution *highs_solution,HighsTimer *qp_timer)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  pointer *ppBVar1;
  pointer *ppiVar2;
  HighsBasisStatus HVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  HighsStatus HVar13;
  QpAsmStatus QVar14;
  double *pdVar15;
  int iVar16;
  pointer pdVar17;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *__nbytes;
  ulong uVar18;
  ulong uVar19;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  double extraout_XMM0_Qa;
  double dVar26;
  double dVar27;
  HighsSolution *highs_solution_00;
  QpModelStatus qp_model_status;
  BasisStatus local_5ccc;
  vector<BasisStatus,_std::allocator<BasisStatus>_> atlower;
  vector<BasisStatus,_std::allocator<BasisStatus>_> initial_status;
  vector<int,_std::allocator<int>_> debug_col_status_count;
  vector<int,_std::allocator<int>_> initialinactive;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c28;
  undefined1 local_5c18 [16];
  undefined1 local_5c08 [8];
  undefined1 auStack_5c00 [16];
  HighsBasisStatus *pHStack_5bf0;
  vector<int,_std::allocator<int>_> initialactive;
  int local_5bc8;
  undefined1 local_5bc4;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5bb8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> vStack_5ba0;
  Statistics *local_5b80;
  vector<double,_std::allocator<double>_> L;
  vector<double,_std::allocator<double>_> vStack_5b58;
  vector<double,_std::allocator<double>_> local_5b40;
  vector<double,_std::allocator<double>_> vStack_5b28;
  QpSolution *local_5b10;
  vector<int,_std::allocator<int>_> debug_row_status_count;
  QpHotstartInformation local_5ae8;
  QpVector x0;
  vector<double,_std::allocator<double>_> local_59f8;
  vector<double,_std::allocator<double>_> local_59e0;
  vector<double,_std::allocator<double>_> local_59c8;
  MatrixFormat local_59b0;
  vector<int,_std::allocator<int>_> local_59a0 [2];
  vector<int,_std::allocator<int>_> local_5970;
  vector<double,_std::allocator<double>_> local_5958 [29];
  QpSolution local_5698;
  QpVector ra;
  QpVector res;
  vector<double,_std::allocator<double>_> local_51b0;
  vector<double,_std::allocator<double>_> local_5198;
  pointer local_5180;
  HighsInt local_5178;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5150;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_5138 [149];
  HighsInt local_4330;
  HighsModelStatus local_3fac;
  
  qp_model_status = kUndetermined;
  local_5b80 = stats;
  local_5b10 = (QpSolution *)highs_model_status;
  QpSolution::QpSolution(&local_5698,instance);
  iVar16 = instance->num_var;
  if (0 < (long)iVar16) {
    piVar7 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (instance->Q).mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = 0;
    do {
      iVar12 = piVar7[uVar18];
      lVar21 = (long)iVar12;
      iVar5 = piVar7[uVar18 + 1];
      if (iVar12 < iVar5) {
        pdVar17 = (instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          if (uVar18 == (uint)piVar8[lVar21]) {
            pdVar17[lVar21] = settings->hessianregularizationfactor + pdVar17[lVar21];
          }
          lVar21 = lVar21 + 1;
        } while (iVar5 != lVar21);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (long)iVar16);
  }
  QpHotstartInformation::QpHotstartInformation(&local_5ae8,iVar16,instance->num_con);
  iVar16 = instance->num_var;
  if (iVar16 < 0x3a99 && instance->num_con == 0) {
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize(&L,(ulong)(uint)(iVar16 * iVar16));
    if (instance->num_var != 0) {
      lVar21 = 0;
      uVar18 = 0;
      do {
        piVar7 = (instance->Q).mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = piVar7[uVar18];
        uVar20 = (ulong)(int)uVar6;
        uVar25 = uVar18 + 1;
        if (uVar6 < (uint)piVar7[uVar18 + 1]) {
          do {
            iVar16 = (instance->Q).mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar20];
            uVar24 = (ulong)iVar16;
            if (uVar18 == uVar24) {
              if (iVar16 == 0) {
                dVar26 = 0.0;
              }
              else {
                pdVar15 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar24;
                dVar26 = 0.0;
                uVar19 = uVar24;
                do {
                  dVar26 = dVar26 + *pdVar15 * *pdVar15;
                  pdVar15 = pdVar15 + instance->num_var;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
              dVar26 = (instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar20] - dVar26;
              if (dVar26 < 0.0) {
                dVar26 = sqrt(dVar26);
              }
              else {
                dVar26 = SQRT(dVar26);
              }
              L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[((long)instance->num_var + 1) * uVar24] = dVar26;
            }
            else {
              if (iVar16 == 0) {
                dVar26 = 0.0;
              }
              else {
                dVar26 = 0.0;
                pdVar17 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar19 = uVar24;
                do {
                  dVar26 = dVar26 + *(double *)((long)pdVar17 + lVar21) * pdVar17[uVar24];
                  pdVar17 = pdVar17 + instance->num_var;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
              L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[(long)instance->num_var * uVar24 + uVar18] =
                   ((instance->Q).mat.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar20] - dVar26) /
                   L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[((long)instance->num_var + 1) * uVar24];
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < (ulong)(long)(instance->Q).mat.start.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar25]);
        }
        lVar21 = lVar21 + 8;
        uVar18 = uVar25;
      } while (uVar25 < (ulong)(long)instance->num_var);
    }
    QpVector::operator-(&res,&instance->c);
    lVar21 = (long)res.dim;
    if (0 < lVar21) {
      iVar16 = instance->num_var;
      lVar22 = 0;
      pdVar17 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (lVar22 != 0) {
          dVar26 = res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar22];
          lVar23 = 0;
          pdVar15 = pdVar17;
          do {
            dVar26 = dVar26 - res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar23] * *pdVar15;
            res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] = dVar26;
            lVar23 = lVar23 + 1;
            pdVar15 = pdVar15 + iVar16;
          } while (lVar22 != lVar23);
        }
        res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar22] =
             res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar22] /
             L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[(iVar16 + 1) * (int)lVar22];
        lVar22 = lVar22 + 1;
        pdVar17 = pdVar17 + 1;
      } while (lVar22 != lVar21);
      if (0 < res.dim) {
        iVar16 = instance->num_var;
        pdVar17 = L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + (lVar21 + -1) * (long)iVar16 + -1;
        lVar22 = lVar21;
        do {
          dVar26 = 0.0;
          for (lVar23 = lVar21; lVar22 < lVar23; lVar23 = lVar23 + -1) {
            dVar26 = dVar26 + res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar23 + -1] * pdVar17[lVar23];
          }
          lVar23 = lVar22 + -1;
          res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] =
               (res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar23] - dVar26) /
               L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[(iVar16 + 1) * (int)lVar23];
          pdVar17 = pdVar17 + -(long)iVar16;
          bVar10 = 1 < lVar22;
          lVar22 = lVar23;
        } while (bVar10);
      }
    }
    QpVector::QpVector(&x0,instance->num_var);
    highs_solution_00 = (HighsSolution *)0x3358df;
    QpVector::QpVector(&ra,instance->num_con);
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (0 < instance->num_var) {
      lVar21 = 0;
      do {
        dVar26 = res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar21];
        dVar27 = 0.5 / settings->hessianregularizationfactor;
        if ((((dVar27 < dVar26) &&
             (INFINITY <=
              (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21])) &&
            (pdVar15 = (instance->c).value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar21,
            *pdVar15 <= 0.0 && *pdVar15 != 0.0)) ||
           (((dVar26 < dVar27 &&
             (INFINITY <=
              (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21])) &&
            (0.0 < (instance->c).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar21])))) {
          qp_model_status = kUnbounded;
          goto LAB_00336a12;
        }
        dVar27 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar21];
        iVar16 = (int)lVar21;
        if (dVar26 <= dVar27) {
          res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] = dVar27;
          iVar12 = instance->num_con + iVar16;
          initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(initial_status.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
          if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            highs_solution_00 = (HighsSolution *)0x335a79;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&initialactive,
                       (iterator)
                       initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&initial_status);
          }
          else {
            *initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = iVar12;
            initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(initial_status.
                                 super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,1);
          if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            highs_solution_00 = (HighsSolution *)0x335aa0;
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                      (&atlower,(iterator)
                                atlower.
                                super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                _M_impl.super__Vector_impl_data._M_finish,
                       (BasisStatus *)&initial_status);
          }
          else {
            *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
             super__Vector_impl_data._M_finish = kActiveAtLower;
LAB_00335ad9:
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          dVar27 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar21];
          if (dVar27 <= dVar26) {
            res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar21] = dVar27;
            iVar12 = instance->num_con + iVar16;
            initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(initial_status.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
            if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              highs_solution_00 = (HighsSolution *)0x335abf;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&initialactive,
                         (iterator)
                         initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&initial_status);
            }
            else {
              *initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = iVar12;
              initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(initial_status.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,2);
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = kActiveAtUpper;
              goto LAB_00335ad9;
            }
            highs_solution_00 = (HighsSolution *)0x335b4f;
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                      (&atlower,(iterator)
                                atlower.
                                super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                _M_impl.super__Vector_impl_data._M_finish,
                       (BasisStatus *)&initial_status);
          }
          else {
            iVar12 = instance->num_con + iVar16;
            initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(initial_status.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar12);
            if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              highs_solution_00 = (HighsSolution *)0x335ab2;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&initialinactive,
                         (iterator)
                         initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&initial_status);
            }
            else {
              *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = iVar12;
              initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        if (0.0001 < ABS(res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar21])) {
          x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] =
               res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar21];
          lVar22 = (long)x0.num_nz;
          x0.num_nz = x0.num_nz + 1;
          x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar22] = iVar16;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < instance->num_var);
    }
    if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      qp_model_status = kOptimal;
    }
    std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=(&local_5ae8.status,&atlower);
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.active,&initialactive);
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.inactive,&initialinactive);
    local_5ae8.primal.num_nz = x0.num_nz;
    local_5ae8.primal.dim = x0.dim;
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.primal.index,&x0.index);
    std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.primal.value,&x0.value);
    local_5ae8.rowact.num_nz = ra.num_nz;
    local_5ae8.rowact.dim = ra.dim;
    std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.rowact.index,&ra.index);
    highs_solution_00 = (HighsSolution *)0x335cb6;
    std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.rowact.value,&ra.value);
LAB_00336a12:
    if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a21;
      operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a33;
      operator_delete(initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a45;
      operator_delete(initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (ra.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a57;
      operator_delete(ra.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (ra.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a69;
      operator_delete(ra.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a7b;
      operator_delete(x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a8d;
      operator_delete(x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336a9f;
      operator_delete(res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,
                         res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_2_) != (void *)0x0) {
      highs_solution_00 = (HighsSolution *)0x336ab1;
      operator_delete((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._2_6_,
                                       res.index.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_2_));
    }
    if (L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336ac3;
      operator_delete(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (qp_model_status == kUnbounded) goto LAB_00336c44;
    if (qp_model_status == kOptimal) {
      local_5698.primal.num_nz = local_5ae8.primal.num_nz;
      local_5698.primal.dim = local_5ae8.primal.dim;
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_5698.primal.index,&local_5ae8.primal.index);
      highs_solution_00 = (HighsSolution *)0x336b0b;
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_5698.primal.value,&local_5ae8.primal.value);
      goto LAB_00336c44;
    }
  }
  else {
    cVar11 = '\0';
    if (highs_solution->value_valid == true) {
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      res.num_nz = 0;
      res.dim = 0;
      x0.num_nz = 0;
      x0.dim = 0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)initial_status.
                            super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
      ra.num_nz = 0;
      ra.dim = 0;
      L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      assessQpPrimalFeasibility
                (instance,settings->lambda_zero_threshold,&highs_solution->col_value,
                 &highs_solution->row_value,(HighsInt *)&atlower,(double *)&res,(double *)&x0,
                 (HighsInt *)&initial_status,(double *)&ra,(double *)&L,(double *)&initialactive,
                 (double *)&initialinactive);
      if ((int)initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start == 0 &&
          (int)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start == 0) {
        cVar11 = highs_basis->valid;
      }
      else {
        cVar11 = '\0';
      }
    }
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xffffffff01000100;
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(initialactive.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,0xffffffff);
    initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = &local_5bc8;
    local_5bc8 = 0x656e6f4e;
    local_5bc4 = 0;
    __nbytes = &local_5bb8;
    local_5bb8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_5bb8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5bb8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_5ba0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_5ba0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_5ba0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffff0000);
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (cVar11 == '\0') {
      Highs::Highs((Highs *)&res);
      ppiVar2 = &x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_7_ = 0x5f74757074756f;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._7_1_ = 0x66;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0x6c;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._1_1_ = 0x61;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._2_1_ = 0x67;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0xb;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._3_1_ = 0;
      x0._0_8_ = ppiVar2;
      Highs::setOptionValue((Highs *)&res,(string *)&x0,false);
      if ((pointer *)x0._0_8_ != ppiVar2) {
        operator_delete((void *)x0._0_8_);
      }
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_7_ = 0x766c6f73657270;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._7_1_ = 0x65;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x8;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0;
      x0._0_8_ = ppiVar2;
      Highs::setOptionValue((Highs *)&res,(string *)&x0,&kHighsOnString_abi_cxx11_);
      __buf = extraout_RDX;
      if ((pointer *)x0._0_8_ != ppiVar2) {
        operator_delete((void *)x0._0_8_);
        __buf = extraout_RDX_00;
      }
      dVar26 = settings->time_limit;
      HighsTimer::read(qp_timer,0,__buf,(size_t)__nbytes);
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_7_ = 0x696c5f656d6974;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._7_1_ = 0x6d;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0x69;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._1_1_ = 0x74;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0xa;
      x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._2_1_ = 0;
      dVar26 = dVar26 - extraout_XMM0_Qa;
      dVar27 = 0.001;
      if (0.001 <= dVar26) {
        dVar27 = dVar26;
      }
      x0._0_8_ = ppiVar2;
      Highs::setOptionValue((Highs *)&res,(string *)&x0,dVar27);
      if ((pointer *)x0._0_8_ != ppiVar2) {
        operator_delete((void *)x0._0_8_);
      }
      HighsLp::HighsLp((HighsLp *)&x0);
      std::vector<int,_std::allocator<int>_>::operator=(&local_5970,&(instance->A).mat.index);
      std::vector<int,_std::allocator<int>_>::operator=(local_59a0,&(instance->A).mat.start);
      std::vector<double,_std::allocator<double>_>::operator=(local_5958,&(instance->A).mat.value);
      local_59b0 = kColwise;
      ra.num_nz = 0;
      ra.dim = 0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)&x0.index,(long)instance->num_var,
                 (value_type_conflict1 *)&ra);
      __x = &instance->var_lo;
      std::vector<double,_std::allocator<double>_>::operator=(&x0.value,__x);
      __x_00 = &instance->var_up;
      std::vector<double,_std::allocator<double>_>::operator=(&local_59f8,__x_00);
      std::vector<double,_std::allocator<double>_>::operator=(&local_59e0,&instance->con_lo);
      std::vector<double,_std::allocator<double>_>::operator=(&local_59c8,&instance->con_up);
      x0.num_nz = instance->num_var;
      x0.dim = instance->num_con;
      if ((0 < x0.num_nz & settings->phase1boundfreevars) == 1) {
        pdVar17 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar9 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar18 = 0;
        do {
          if ((pdVar17[uVar18] <= -INFINITY) && (INFINITY <= pdVar9[uVar18])) {
            x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18] = -100000.0;
            local_59f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18] = 100000.0;
          }
          uVar18 = uVar18 + 1;
        } while ((x0._0_8_ & 0xffffffff) != uVar18);
      }
      HighsLp::HighsLp((HighsLp *)&ra,(HighsLp *)&x0);
      Highs::passModel((Highs *)&res,(HighsLp *)&ra);
      HighsLp::~HighsLp((HighsLp *)&ra);
      if (settings->phase1movefreevarsbasic == true) {
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_5c28;
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_5c28._M_allocated_capacity._0_4_ = 0x656e6f4e;
        local_5c28._M_local_buf[4] = '\0';
        local_5c18 = (undefined1  [16])0x0;
        _local_5c08 = (undefined1  [16])0x0;
        stack0xffffffffffffa408 = (undefined1  [16])0x0;
        initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xffffffff01000100;
        if (0 < instance->num_con) {
          iVar16 = 0;
          do {
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(atlower.
                                   super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,4);
            if ((HighsBasisStatus *)auStack_5c00._8_8_ == pHStack_5bf0) {
              std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
              _M_realloc_insert<HighsBasisStatus>
                        ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                         (local_5c08 + 8),(iterator)auStack_5c00._8_8_,(HighsBasisStatus *)&atlower)
              ;
            }
            else {
              *(HighsBasisStatus *)auStack_5c00._8_8_ = kNonbasic;
              auStack_5c00._8_8_ = (HighsBasisStatus *)(auStack_5c00._8_8_ + 1);
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < instance->num_con);
        }
        if (0 < instance->num_var) {
          lVar21 = 0;
          do {
            if ((-INFINITY <
                 (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar21]) ||
               ((__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar21] < INFINITY)) {
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(atlower.
                                     super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,4);
              if ((undefined1  [8])local_5c18._8_8_ != local_5c08) {
                *(HighsBasisStatus *)local_5c18._8_8_ = kNonbasic;
                goto LAB_003367d3;
              }
              std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
              _M_realloc_insert<HighsBasisStatus>
                        ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)local_5c18,
                         (iterator)local_5c18._8_8_,(HighsBasisStatus *)&atlower);
            }
            else {
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(atlower.
                                     super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,1);
              if ((undefined1  [8])local_5c18._8_8_ == local_5c08) {
                std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
                _M_realloc_insert<HighsBasisStatus>
                          ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)local_5c18
                           ,(iterator)local_5c18._8_8_,(HighsBasisStatus *)&atlower);
              }
              else {
                *(HighsBasisStatus *)local_5c18._8_8_ = kBasic;
LAB_003367d3:
                local_5c18._8_8_ = (HighsBasisStatus *)(local_5c18._8_8_ + 1);
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < instance->num_var);
        }
        ppBVar1 = &atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppBVar1;
        Highs::setBasis((Highs *)&res,(HighsBasis *)&initialinactive,(string *)&atlower);
        if ((pointer *)
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start != ppBVar1) {
          operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x10;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppBVar1;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)std::__cxx11::string::_M_create((ulong *)&atlower,(ulong)&initial_status);
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(undefined8 *)
         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
         super__Vector_impl_data._M_start = 0x5f78656c706d6973;
        *(undefined8 *)
         (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start + 2) = 0x7967657461727473;
        atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_finish =
             initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(char *)((long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                 (long)initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                       _M_impl.super__Vector_impl_data._M_start) = '\0';
        Highs::setOptionValue((Highs *)&res,(string *)&atlower,4);
        if ((pointer *)
            atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start != ppBVar1) {
          operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer)auStack_5c00._0_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_5c00._0_8_);
        }
        if ((pointer)local_5c18._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_5c18._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != &local_5c28) {
          operator_delete(initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        }
      }
      HVar13 = Highs::run((Highs *)&res);
      if (HVar13 == kError) {
        qp_model_status = kError;
      }
      else {
        if ((int)local_3fac < 0xd) {
          if (local_3fac == kOptimal) {
            qp_model_status = kNotset;
          }
          else if (local_3fac == kInfeasible) {
            qp_model_status = kInfeasible;
          }
          else {
LAB_00336b2e:
            qp_model_status = kError;
          }
        }
        else if (local_3fac == kTimeLimit) {
          qp_model_status = kTimeLimit;
        }
        else {
          if (local_3fac != kInterrupt) goto LAB_00336b2e;
          qp_model_status = kInterrupt;
        }
        local_5b80->phase1_iterations = local_4330;
        if (qp_model_status == kNotset) {
          initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_finish._4_4_,local_5178);
          initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = local_5180;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                    (&local_5bb8,&local_5150);
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                    (&vStack_5ba0,local_5138);
          L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT62(L.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                       .super__Vector_impl_data._M_start._2_6_,
                                       res.index.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_2_);
          std::vector<double,_std::allocator<double>_>::operator=
                    ((vector<double,_std::allocator<double>_> *)
                     &L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                     (vector<double,_std::allocator<double>_> *)
                     &res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          std::vector<double,_std::allocator<double>_>::operator=
                    (&vStack_5b58,
                     (vector<double,_std::allocator<double>_> *)
                     &res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          std::vector<double,_std::allocator<double>_>::operator=(&local_5b40,&local_51b0);
          std::vector<double,_std::allocator<double>_>::operator=(&vStack_5b28,&local_5198);
          HighsLp::~HighsLp((HighsLp *)&x0);
          Highs::~Highs((Highs *)&res);
          dVar26 = 0.0001;
          goto LAB_00335de9;
        }
      }
      HighsLp::~HighsLp((HighsLp *)&x0);
      highs_solution_00 = (HighsSolution *)0x336b80;
      Highs::~Highs((Highs *)&res);
    }
    else {
      initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(initialactive.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    highs_basis->debug_update_count);
      initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)highs_basis;
      std::__cxx11::string::_M_assign
                ((string *)
                 &initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&local_5bb8,&highs_basis->col_status);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&vStack_5ba0,&highs_basis->row_status);
      uVar4._0_1_ = highs_solution->value_valid;
      uVar4._1_1_ = highs_solution->dual_valid;
      L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)CONCAT62(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start._2_6_,uVar4);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)
                 &L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish,&highs_solution->col_value);
      std::vector<double,_std::allocator<double>_>::operator=
                (&vStack_5b58,&highs_solution->col_dual);
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_5b40,&highs_solution->row_value);
      std::vector<double,_std::allocator<double>_>::operator=
                (&vStack_5b28,&highs_solution->row_dual);
      qp_model_status = kNotset;
      dVar26 = 0.0;
LAB_00335de9:
      QpVector::QpVector(&res,instance->num_var);
      QpVector::QpVector(&x0,instance->num_con);
      if (0 < res.dim) {
        lVar21 = 0;
        do {
          if (dVar26 < ABS(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish[lVar21])) {
            res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar21] =
                 L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[lVar21];
            lVar22 = (long)res.num_nz;
            res.num_nz = res.num_nz + 1;
            *(int *)(CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._2_6_,
                              res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_2_) + lVar22 * 4) = (int)lVar21;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < res.dim);
      }
      if (0 < x0.dim) {
        lVar21 = 0;
        do {
          if (dVar26 < ABS(local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar21])) {
            x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar21] =
                 local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar21];
            lVar22 = (long)x0.num_nz;
            x0.num_nz = x0.num_nz + 1;
            x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar22] = (int)lVar21;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < x0.dim);
      }
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&debug_row_status_count,5,(value_type_conflict2 *)&debug_col_status_count);
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      if (0 < (int)vStack_5ba0.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)vStack_5ba0.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start) {
        iVar16 = 0;
        do {
          HVar3 = vStack_5ba0.
                  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar16];
          debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[HVar3] =
               debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[HVar3] + 1;
          switch((ulong)HVar3) {
          case 0:
            if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&initialinactive,
                         (iterator)
                         initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&debug_col_status_count);
            }
            else {
              *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_5ccc = kActiveAtLower;
            if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                        (&initial_status,
                         (iterator)
                         initial_status.
                         super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_5ccc);
            }
            else {
              *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = kActiveAtLower;
LAB_00336069:
              initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            break;
          case 1:
            break;
          case 2:
            if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&initialinactive,
                         (iterator)
                         initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&debug_col_status_count);
            }
            else {
              *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_5ccc = kActiveAtUpper;
            if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = kActiveAtUpper;
              goto LAB_00336069;
            }
            std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                      (&initial_status,
                       (iterator)
                       initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_5ccc);
            break;
          default:
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&debug_col_status_count);
            }
            else {
              *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          iVar16 = (BasisStatus)
                   debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
          debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(debug_col_status_count.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,iVar16);
        } while (iVar16 < (int)vStack_5ba0.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                          (int)vStack_5ba0.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      }
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5ccc = kInactive;
      highs_solution_00 = (HighsSolution *)0x3360d9;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                (&debug_col_status_count,5,(value_type_conflict2 *)&local_5ccc);
      if (0 < (int)local_5bb8.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)local_5bb8.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start) {
        lVar21 = 0;
        do {
          HVar3 = local_5bb8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar21];
          debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[HVar3] =
               debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[HVar3] + 1;
          iVar16 = (int)lVar21;
          switch((ulong)HVar3) {
          case 0:
            if ((-INFINITY <
                 (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar21]) ||
               ((instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar21] < INFINITY)) {
              local_5ccc = instance->num_con + iVar16;
              if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                highs_solution_00 = (HighsSolution *)0x3362cb;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&initialinactive,
                           (iterator)
                           initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_5ccc);
              }
              else {
                *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_5ccc;
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_5ccc = kActiveAtLower;
              if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                highs_solution_00 = (HighsSolution *)0x33630c;
                std::vector<BasisStatus,_std::allocator<BasisStatus>_>::
                _M_realloc_insert<BasisStatus>
                          (&initial_status,
                           (iterator)
                           initial_status.
                           super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_5ccc);
              }
              else {
                *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                 _M_impl.super__Vector_impl_data._M_finish = kActiveAtLower;
LAB_003362e5:
                initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              local_5ccc = instance->num_con + iVar16;
              if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00336218;
              highs_solution_00 = (HighsSolution *)0x33617e;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&local_5ccc);
            }
            break;
          case 1:
            break;
          case 2:
            if ((-INFINITY <
                 (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar21]) ||
               ((instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar21] < INFINITY)) {
              local_5ccc = instance->num_con + iVar16;
              if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                highs_solution_00 = (HighsSolution *)0x33629f;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&initialinactive,
                           (iterator)
                           initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_5ccc);
              }
              else {
                *initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_5ccc;
                initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_5ccc = kActiveAtUpper;
              if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                *initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                 _M_impl.super__Vector_impl_data._M_finish = kActiveAtUpper;
                goto LAB_003362e5;
              }
              highs_solution_00 = (HighsSolution *)0x3362fd;
              std::vector<BasisStatus,_std::allocator<BasisStatus>_>::_M_realloc_insert<BasisStatus>
                        (&initial_status,
                         (iterator)
                         initial_status.
                         super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_5ccc);
            }
            else {
              local_5ccc = instance->num_con + iVar16;
              if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00336218;
              highs_solution_00 = (HighsSolution *)0x3361d5;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&local_5ccc);
            }
            break;
          case 3:
            local_5ccc = instance->num_con + iVar16;
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              highs_solution_00 = (HighsSolution *)0x3361fc;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)&atlower,
                         (iterator)
                         atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(int *)&local_5ccc);
            }
            else {
LAB_00336218:
              *atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish = local_5ccc;
              atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            break;
          default:
            local_5ccc = instance->num_con + iVar16;
            if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00336218;
            highs_solution_00 = (HighsSolution *)0x33628d;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)&atlower,
                       (iterator)
                       atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl
                       .super__Vector_impl_data._M_finish,(int *)&local_5ccc);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < (int)local_5bb8.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_5bb8.
                               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      }
      if (instance->num_var ==
          (int)((ulong)((long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2) +
          (int)((ulong)((long)initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
        std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator=
                  (&local_5ae8.status,&initial_status);
        std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.active,&initialinactive);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_5ae8.inactive,(vector<int,_std::allocator<int>_> *)&atlower);
        local_5ae8.primal.num_nz = res.num_nz;
        local_5ae8.primal.dim = res.dim;
        std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.primal.index,&res.index);
        std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.primal.value,&res.value)
        ;
        local_5ae8.rowact.num_nz = x0.num_nz;
        local_5ae8.rowact.dim = x0.dim;
        std::vector<int,_std::allocator<int>_>::operator=(&local_5ae8.rowact.index,&x0.index);
        highs_solution_00 = (HighsSolution *)0x336401;
        std::vector<double,_std::allocator<double>_>::operator=(&local_5ae8.rowact.value,&x0.value);
      }
      else {
        qp_model_status = kError;
      }
      if (debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x33696d;
        operator_delete(debug_col_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x33697f;
        operator_delete(debug_row_status_count.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x33698e;
        operator_delete(initial_status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x33699d;
        operator_delete(atlower.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x3369af;
        operator_delete(initialinactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x3369c1;
        operator_delete(x0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x3369d3;
        operator_delete(x0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        highs_solution_00 = (HighsSolution *)0x3369e5;
        operator_delete(res.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._2_6_,
                           res.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_2_) != (void *)0x0) {
        highs_solution_00 = (HighsSolution *)0x3369fb;
        operator_delete((void *)CONCAT62(res.index.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._2_6_,
                                         res.index.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_2_));
      }
    }
    if (vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336b92;
      operator_delete(vStack_5b28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336ba4;
      operator_delete(local_5b40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336bb6;
      operator_delete(vStack_5b58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (L.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336bc8;
      operator_delete(L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    if (vStack_5ba0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336bda;
      operator_delete(vStack_5ba0.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_5bb8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      highs_solution_00 = (HighsSolution *)0x336bec;
      operator_delete(local_5bb8.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != &local_5bc8) {
      highs_solution_00 = (HighsSolution *)0x336c06;
      operator_delete(initialactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (qp_model_status != kNotset) goto LAB_00336c44;
  }
  solveqp_actual(instance,settings,&local_5ae8,local_5b80,&qp_model_status,&local_5698,qp_timer);
LAB_00336c44:
  QVar14 = quass2highs(instance,settings,(Statistics *)&qp_model_status,(QpModelStatus *)&local_5698
                       ,local_5b10,(HighsModelStatus *)highs_basis,(HighsBasis *)highs_solution,
                       highs_solution_00);
  if (local_5ae8.rowact.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.rowact.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5ae8.rowact.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.rowact.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5ae8.primal.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.primal.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5ae8.primal.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.primal.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5ae8.status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.status.super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5ae8.inactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.inactive.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5ae8.active.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ae8.active.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  QpSolution::~QpSolution(&local_5698);
  return QVar14;
}

Assistant:

QpAsmStatus solveqp(Instance& instance, Settings& settings, Statistics& stats,
                    HighsModelStatus& highs_model_status,
                    HighsBasis& highs_basis, HighsSolution& highs_solution,
                    HighsTimer& qp_timer) {
  QpModelStatus qp_model_status = QpModelStatus::kUndetermined;

  QpSolution qp_solution(instance);

  // presolve

  // scale instance, store scaling factors

  // perturb instance, store perturbance information

  // regularize
  for (HighsInt i = 0; i < instance.num_var; i++) {
    for (HighsInt index = instance.Q.mat.start[i];
         index < instance.Q.mat.start[i + 1]; index++) {
      if (instance.Q.mat.index[index] == i) {
        instance.Q.mat.value[index] += settings.hessianregularizationfactor;
      }
    }
  }

  // compute initial feasible point
  QpHotstartInformation startinfo(instance.num_var, instance.num_con);
  if (instance.num_con == 0 && instance.num_var <= 15000) {
    computeStartingPointBounded(instance, settings, stats, qp_model_status,
                                startinfo, qp_timer);
    if (qp_model_status == QpModelStatus::kOptimal) {
      qp_solution.primal = startinfo.primal;
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
    if (qp_model_status == QpModelStatus::kUnbounded) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  } else {
    computeStartingPointHighs(instance, settings, stats, qp_model_status,
                              startinfo, highs_model_status, highs_basis,
                              highs_solution, qp_timer);
    if (qp_model_status != QpModelStatus::kNotset) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  }

  // solve
  solveqp_actual(instance, settings, startinfo, stats, qp_model_status,
                 qp_solution, qp_timer);

  // undo perturbation and resolve

  // undo scaling and resolve

  // postsolve

  // Transform QP status and qp_solution to HiGHS highs_basis and highs_solution
  return quass2highs(instance, settings, stats, qp_model_status, qp_solution,
                     highs_model_status, highs_basis, highs_solution);
}